

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O0

void mpiabi_file_open_(MPIABI_Fint *comm,char *filename,MPIABI_Fint *amode,MPIABI_Fint *info,
                      MPIABI_Fint *fh,MPIABI_Fint *ierror,size_t filename_len)

{
  MPIABI_Fint *ierror_local;
  MPIABI_Fint *fh_local;
  MPIABI_Fint *info_local;
  MPIABI_Fint *amode_local;
  char *filename_local;
  MPIABI_Fint *comm_local;
  
  mpi_file_open_(comm,filename,amode,info,fh,ierror,filename_len);
  return;
}

Assistant:

void mpiabi_file_open_(
  const MPIABI_Fint * comm,
  const char * filename,
  const MPIABI_Fint * amode,
  const MPIABI_Fint * info,
  MPIABI_Fint * fh,
  MPIABI_Fint * ierror,
  size_t filename_len
) {
  return mpi_file_open_(
    comm,
    filename,
    amode,
    info,
    fh,
    ierror,
    filename_len
  );
}